

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharClass.hpp
# Opt level: O3

CharClass<char> * __thiscall
Centaurus::CharClass<char>::operator~(CharClass<char> *__return_storage_ptr__,CharClass<char> *this)

{
  pointer pRVar1;
  char cVar2;
  undefined8 in_RAX;
  pointer pRVar3;
  char last_end;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  CharClass(__return_storage_ptr__);
  pRVar3 = (this->m_ranges).
           super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uStack_38._0_6_ = CONCAT15(1,(undefined5)uStack_38);
  cVar2 = '\x01';
  pRVar1 = (this->m_ranges).
           super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if ((pRVar3 != pRVar1) && (pRVar3->m_start == '\x01')) {
    cVar2 = pRVar3->m_end;
    pRVar3 = pRVar3 + 1;
    uStack_38._0_6_ = CONCAT15(cVar2,(undefined5)uStack_38);
  }
  if (pRVar3 != pRVar1) {
    do {
      uStack_38._0_7_ = CONCAT16(pRVar3->m_start,(undefined6)uStack_38);
      std::vector<Centaurus::Range<char>,std::allocator<Centaurus::Range<char>>>::
      emplace_back<char&,char>
                ((vector<Centaurus::Range<char>,std::allocator<Centaurus::Range<char>>> *)
                 &__return_storage_ptr__->m_ranges,(char *)((long)&uStack_38 + 5),
                 (char *)((long)&uStack_38 + 6));
      cVar2 = pRVar3->m_end;
      pRVar3 = pRVar3 + 1;
      uStack_38._0_6_ = CONCAT15(cVar2,(undefined5)uStack_38);
    } while (pRVar3 != (this->m_ranges).
                       super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  if (cVar2 != -1) {
    uStack_38 = CONCAT17(0xff,(undefined7)uStack_38);
    std::vector<Centaurus::Range<char>,std::allocator<Centaurus::Range<char>>>::
    emplace_back<char&,char>
              ((vector<Centaurus::Range<char>,std::allocator<Centaurus::Range<char>>> *)
               &__return_storage_ptr__->m_ranges,(char *)((long)&uStack_38 + 5),
               (char *)((long)&uStack_38 + 7));
  }
  return __return_storage_ptr__;
}

Assistant:

CharClass<TCHAR> operator~() const
    {
        CharClass<TCHAR> cc;

		typename std::vector<Range<TCHAR> >::const_iterator i = m_ranges.cbegin();
		TCHAR last_end = 1;

		if (i != m_ranges.cend())
		{
			if (i->start() == 1)
			{
				last_end = i->end();
				i++;
			}
		}

		for (; i != m_ranges.cend(); i++)
		{
			cc.m_ranges.emplace_back(last_end, i->start());
			last_end = i->end();
		}

		if (last_end < std::numeric_limits<TCHAR>::max())
			cc.m_ranges.emplace_back(last_end, std::numeric_limits<TCHAR>::max());

        return cc;
    }